

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaG_errormsg(lua_State *L)

{
  long lVar1;
  StkId pTVar2;
  int errcode;
  StkId pTVar3;
  
  lVar1 = L->errfunc;
  if (lVar1 != 0) {
    pTVar3 = L->stack;
    if (*(int *)((long)&pTVar3->tt + lVar1) != 6) {
      errcode = 5;
      goto LAB_00104940;
    }
    pTVar2 = L->top;
    pTVar2->value = pTVar2[-1].value;
    pTVar2->tt = pTVar2[-1].tt;
    pTVar2 = L->top;
    pTVar2[-1].value = *(Value *)((long)&pTVar3->value + lVar1);
    pTVar2[-1].tt = *(int *)((long)&pTVar3->tt + lVar1);
    pTVar3 = L->top;
    if ((long)L->stack_last - (long)pTVar3 < 0x11) {
      luaD_growstack(L,1);
      pTVar3 = L->top;
    }
    L->top = pTVar3 + 1;
    luaD_call(L,pTVar3 + -1,1);
  }
  errcode = 2;
LAB_00104940:
  luaD_throw(L,errcode);
}

Assistant:

static void luaG_errormsg(lua_State*L){
if(L->errfunc!=0){
StkId errfunc=restorestack(L,L->errfunc);
if(!ttisfunction(errfunc))luaD_throw(L,5);
setobj(L,L->top,L->top-1);
setobj(L,L->top-1,errfunc);
incr_top(L);
luaD_call(L,L->top-2,1);
}
luaD_throw(L,2);
}